

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O0

int pkey_rsa_verify(EVP_PKEY_CTX *ctx,uint8_t *sig,size_t siglen,uint8_t *tbs,size_t tbslen)

{
  int iVar1;
  int iVar2;
  size_t key_len;
  size_t rslen;
  RSA *rsa;
  RSA_PKEY_CTX *rctx;
  size_t tbslen_local;
  uint8_t *tbs_local;
  size_t siglen_local;
  uint8_t *sig_local;
  EVP_PKEY_CTX *ctx_local;
  
  rsa = (RSA *)ctx->data;
  rslen = (size_t)ctx->pkey->pkey;
  rctx = (RSA_PKEY_CTX *)tbslen;
  tbslen_local = (size_t)tbs;
  tbs_local = (uint8_t *)siglen;
  siglen_local = (size_t)sig;
  sig_local = (uint8_t *)ctx;
  if (rsa->d == (BIGNUM *)0x0) {
    iVar1 = EVP_PKEY_size((EVP_PKEY *)ctx->pkey);
    iVar2 = setup_tbuf((RSA_PKEY_CTX *)rsa,(EVP_PKEY_CTX *)sig_local);
    if ((iVar2 != 0) &&
       (iVar1 = RSA_verify_raw((RSA *)rslen,&key_len,(uint8_t *)rsa->dmp1,(long)iVar1,
                               (uint8_t *)siglen_local,(size_t)tbs_local,*(int *)&rsa->e),
       iVar1 != 0)) {
      if (((RSA_PKEY_CTX *)key_len == rctx) &&
         (iVar1 = CRYPTO_memcmp((void *)tbslen_local,rsa->dmp1,key_len), iVar1 == 0)) {
        return 1;
      }
      ERR_put_error(4,0,0x69,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0xc4);
      return 0;
    }
    ctx_local._4_4_ = 0;
  }
  else if (*(int *)&rsa->e == 1) {
    iVar1 = EVP_MD_type((EVP_MD *)rsa->d);
    ctx_local._4_4_ =
         RSA_verify(iVar1,(uchar *)tbslen_local,(uint)rctx,(uchar *)siglen_local,(uint)tbs_local,
                    (RSA *)rslen);
  }
  else if (*(int *)&rsa->e == 6) {
    ctx_local._4_4_ =
         RSA_verify_pss_mgf1((RSA *)rslen,tbs,tbslen,(EVP_MD *)rsa->d,(EVP_MD *)rsa->p,
                             *(int *)&rsa->q,sig,siglen);
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_rsa_verify(EVP_PKEY_CTX *ctx, const uint8_t *sig, size_t siglen,
                           const uint8_t *tbs, size_t tbslen) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);
  RSA *rsa = reinterpret_cast<RSA *>(ctx->pkey->pkey);

  if (rctx->md) {
    switch (rctx->pad_mode) {
      case RSA_PKCS1_PADDING:
        return RSA_verify(EVP_MD_type(rctx->md), tbs, tbslen, sig, siglen, rsa);

      case RSA_PKCS1_PSS_PADDING:
        return RSA_verify_pss_mgf1(rsa, tbs, tbslen, rctx->md, rctx->mgf1md,
                                   rctx->saltlen, sig, siglen);

      default:
        return 0;
    }
  }

  size_t rslen;
  const size_t key_len = EVP_PKEY_size(ctx->pkey);
  if (!setup_tbuf(rctx, ctx) ||
      !RSA_verify_raw(rsa, &rslen, rctx->tbuf, key_len, sig, siglen,
                      rctx->pad_mode)) {
    return 0;
  }
  if (rslen != tbslen || CRYPTO_memcmp(tbs, rctx->tbuf, rslen) != 0) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_SIGNATURE);
    return 0;
  }

  return 1;
}